

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::yy_print_<tchecker::parsing::system::parser_t::by_state>
          (parser_t *this,ostream *yyo,
          basic_symbol<tchecker::parsing::system::parser_t::by_state> *yysym)

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  attributes_t *attr;
  int *piVar6;
  shared_ptr<tchecker::parsing::attr_t> *psVar7;
  vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
  *pvVar8;
  sync_strength_t *psVar9;
  shared_ptr<tchecker::parsing::sync_constraint_t> *psVar10;
  char *pcVar11;
  pointer psVar12;
  int iVar13;
  value_type *this_00;
  string local_48;
  
  cVar1 = (yysym->super_by_state).state;
  lVar2 = (long)cVar1;
  if ((lVar2 != 0) && (yystos_[lVar2] != -2)) {
    if (cVar1 == '\0') {
      iVar13 = -2;
    }
    else {
      iVar13 = (int)(char)yystos_[lVar2];
    }
    pcVar11 = "nterm";
    if (iVar13 < 0x14) {
      pcVar11 = "token";
    }
    std::__ostream_insert<char,std::char_traits<char>>(yyo,pcVar11,5);
    local_48._M_dataplus._M_p._0_1_ = 0x20;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(yyo,(char *)&local_48,1);
    basic_symbol<tchecker::parsing::system::parser_t::by_state>::name_abi_cxx11_(&local_48,yysym);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                                local_48._M_dataplus._M_p._0_1_),
                        local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    pbVar4 = system::operator<<(poVar3,&yysym->location);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar4,": ",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
                      local_48.field_2._M_allocated_capacity + 1);
    }
    switch(iVar13) {
    case 0xc:
    case 0xe:
    case 0x13:
    case 0x1d:
      pbVar5 = value_type::as<std::__cxx11::string>(&yysym->value);
      std::__ostream_insert<char,std::char_traits<char>>
                (yyo,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
      break;
    case 0x1a:
    case 0x1b:
      attr = value_type::as<tchecker::parsing::attributes_t>(&yysym->value);
      parsing::operator<<(yyo,attr);
      break;
    case 0x1c:
      psVar7 = value_type::as<std::shared_ptr<tchecker::parsing::attr_t>>(&yysym->value);
      parsing::operator<<(yyo,(psVar7->
                              super___shared_ptr<tchecker::parsing::attr_t,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
      break;
    case 0x1e:
      this_00 = &yysym->value;
      pvVar8 = value_type::
               as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                         (this_00);
      psVar12 = (pvVar8->
                super__Vector_base<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar8 = value_type::
               as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                         (this_00);
      if (psVar12 !=
          (pvVar8->
          super__Vector_base<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pvVar8 = value_type::
                   as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                             (this_00);
          if (psVar12 !=
              (pvVar8->
              super__Vector_base<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>(yyo,",",1);
          }
          std::ostream::_M_insert<void_const*>(yyo);
          psVar12 = psVar12 + 1;
          pvVar8 = value_type::
                   as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                             (this_00);
        } while (psVar12 !=
                 (pvVar8->
                 super__Vector_base<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      }
      break;
    case 0x1f:
      psVar10 = value_type::as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(&yysym->value)
      ;
      parsing::operator<<(yyo,(psVar10->
                              super___shared_ptr<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
      break;
    case 0x20:
      psVar9 = value_type::as<tchecker::sync_strength_t>(&yysym->value);
      tchecker::operator<<(yyo,*psVar9);
      break;
    case 0x23:
      piVar6 = value_type::as<int>(&yysym->value);
      std::ostream::operator<<((ostream *)yyo,*piVar6);
      break;
    case 0x24:
      value_type::as<unsigned_int>(&yysym->value);
      std::ostream::_M_insert<unsigned_long>((ulong)yyo);
    }
    local_48._M_dataplus._M_p._0_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(yyo,(char *)&local_48,1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(yyo,"empty symbol",0xc);
  return;
}

Assistant:

void
  parser_t::yy_print_ (std::ostream& yyo, const basic_symbol<Base>& yysym) const
  {
    std::ostream& yyoutput = yyo;
    YY_USE (yyoutput);
    if (yysym.empty ())
      yyo << "empty symbol";
    else
      {
        symbol_kind_type yykind = yysym.kind ();
        yyo << (yykind < YYNTOKENS ? "token" : "nterm")
            << ' ' << yysym.name () << " ("
            << yysym.location << ": ";
        switch (yykind)
    {
      case symbol_kind::S_TOK_ID: // "identifier"
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 447 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_TOK_INTEGER: // "integer value"
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 453 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_TOK_TEXT: // "text value"
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 459 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_attr_list: // attr_list
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < tchecker::parsing::attributes_t > (); }
#line 465 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < tchecker::parsing::attributes_t > (); }
#line 471 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_attr: // attr
#line 95 "system.yy"
                 { yyoutput << * yysym.value.template as < std::shared_ptr<tchecker::parsing::attr_t> > (); }
#line 477 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_text_or_empty: // text_or_empty
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < std::string > (); }
#line 483 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
#line 98 "system.yy"
                 {
  for (auto it = yysym.value.template as < std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ().begin(); it != yysym.value.template as < std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ().end(); ++it) {
    if (it != yysym.value.template as < std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ().begin())
      yyoutput << ",";
    yyoutput << *it;
  }
}
#line 495 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
#line 95 "system.yy"
                 { yyoutput << * yysym.value.template as < std::shared_ptr<tchecker::parsing::sync_constraint_t> > (); }
#line 501 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_sync_strength: // sync_strength
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < enum tchecker::sync_strength_t > (); }
#line 507 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_integer: // integer
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < tchecker::integer_t > (); }
#line 513 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      case symbol_kind::S_uinteger: // uinteger
#line 94 "system.yy"
                 { yyoutput << yysym.value.template as < unsigned int > (); }
#line 519 "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.cc"
        break;

      default:
        break;
    }
        yyo << ')';
      }
  }